

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O0

void __thiscall
tchecker::details::
statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>::visit
          (statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_local_var_statement_t *stmt)

{
  typed_var_expression_t *ptVar1;
  typed_expression_t *ptVar2;
  value_type_conflict3 local_60;
  vector<long,_std::allocator<long>_> *local_58;
  undefined1 local_50 [8];
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  rvalue_compiler;
  undefined1 local_28 [8];
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  lvalue_compiler;
  typed_local_var_statement_t *stmt_local;
  statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  *this_local;
  
  lvalue_compiler._bytecode_back_inserter.container = (vector<long,_std::allocator<long>_> *)stmt;
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  ::lvalue_expression_compiler_t
            ((lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_28,(this->_bytecode_back_inserter).container);
  ptVar1 = typed_local_var_statement_t::variable
                     ((typed_local_var_statement_t *)
                      lvalue_compiler._bytecode_back_inserter.container);
  (**(code **)(*(long *)&(ptVar1->super_typed_lvalue_expression_t).super_typed_expression_t + 0x30))
            (ptVar1,local_28);
  local_58 = (this->_bytecode_back_inserter).container;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  ::rvalue_expression_compiler_t
            ((rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_50,(back_insert_iterator<std::vector<long,_std::allocator<long>_>_>)local_58);
  ptVar2 = typed_local_var_statement_t::initial_value
                     ((typed_local_var_statement_t *)
                      lvalue_compiler._bytecode_back_inserter.container);
  (**(code **)(*(long *)ptVar2 + 0x30))(ptVar2,local_50);
  local_60 = 0x1c;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,&local_60);
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  ::~rvalue_expression_compiler_t
            ((rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_50);
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  ::~lvalue_expression_compiler_t
            ((lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_28);
  return;
}

Assistant:

virtual void visit(tchecker::typed_local_var_statement_t const & stmt)
  {
    tchecker::details::lvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> lvalue_compiler(_bytecode_back_inserter);
    stmt.variable().visit(lvalue_compiler);
    tchecker::details::rvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> rvalue_compiler(_bytecode_back_inserter);
    stmt.initial_value().visit(rvalue_compiler);
    _bytecode_back_inserter = VM_INIT_FRAME;
  }